

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.h
# Opt level: O2

StringRef __thiscall llbuild::ninja::Scope::lookupBinding(Scope *this,StringRef name)

{
  const_iterator cVar1;
  StringRef SVar2;
  
  cVar1 = llvm::
          StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
          ::find(&this->entries,name);
  if (cVar1.
      super_StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .Ptr == (StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )((this->entries).super_StringMapImpl.TheTable +
                (this->entries).super_StringMapImpl.NumBuckets)) {
    if (this->parent == (Scope *)0x0) {
      SVar2 = (StringRef)ZEXT816(0x1b472f);
    }
    else {
      SVar2 = lookupBinding(this->parent,name);
    }
  }
  else {
    SVar2 = *(StringRef *)
             (*(long *)cVar1.
                       super_StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .Ptr + 8);
  }
  return SVar2;
}

Assistant:

StringRef lookupBinding(StringRef name) const {
    auto it = entries.find(name);
    if (it != entries.end())
      return it->second;

    if (parent)
      return parent->lookupBinding(name);

    return "";
  }